

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
         *this,JavascriptString **key)

{
  WriteBarrierPtr<Js::JavascriptString> *addr;
  uint uVar1;
  Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
  *pEVar2;
  bool bVar3;
  hash_t hashCode;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  uint depth;
  
  piVar5 = (this->buckets).ptr;
  depth = 0;
  if (piVar5 != (int *)0x0) {
    hashCode = BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
               ::GetHashCodeWithKey<Js::JavascriptString*>(key);
    uVar4 = GetBucket(hashCode,this->bucketCount,this->modFunctionIndex);
    uVar1 = piVar5[uVar4];
    uVar7 = (ulong)(int)uVar1;
    depth = 0;
    if (-1 < (long)uVar7) {
      pEVar2 = (this->entries).ptr;
      bVar3 = CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::
              KeyEquals<Js::PropertyRecordStringHashComparer<Js::JavascriptString*>,Js::JavascriptString*>
                        ((CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                          *)(pEVar2 + uVar7),key,hashCode);
      if (bVar3) {
        depth = 0;
        uVar6 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar6 = uVar1;
          depth = depth + 1;
          uVar1 = pEVar2[uVar6].
                  super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                  .
                  super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                  .
                  super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                  .
                  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                  .next;
          uVar7 = (ulong)(int)uVar1;
          if ((long)uVar7 < 0) goto LAB_00e2ea34;
          bVar3 = CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                  ::
                  KeyEquals<Js::PropertyRecordStringHashComparer<Js::JavascriptString*>,Js::JavascriptString*>
                            ((CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                              *)(pEVar2 + uVar7),key,hashCode);
        } while (!bVar3);
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      pEVar2 = (this->entries).ptr;
      addr = &pEVar2[uVar7 & 0xffffffff].
              super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
              .
              super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .
              super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
              .
              super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
              .
              super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
              .key;
      piVar5 = &pEVar2[uVar6].
                super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                .
                super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                .
                super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                .
                super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                .next;
      if ((int)uVar6 < 0) {
        piVar5 = (this->buckets).ptr + uVar4;
      }
      *piVar5 = ((KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                  *)(addr + -1))->next;
      *(undefined1 *)&addr[-1].ptr = 1;
      *(PropertyAttributes *)((long)&addr[-1].ptr + 1) = '\a';
      *(unsigned_short *)((long)&addr[-1].ptr + 2) = 0;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = (JavascriptString *)0x0;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      *(undefined4 *)(addr + 1) = 0;
      SetNextFreeEntryIndex
                (this,(this->entries).ptr + (uVar7 & 0xffffffff),
                 -(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = (Type)uVar7;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,(this->buckets).ptr[uVar4] == -1);
      return true;
    }
  }
LAB_00e2ea34:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }